

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

int Acb_ObjToGia2(Gia_Man_t *pNew,int fUseBuf,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp,int fUseXors)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  uint Lit;
  int iVar4;
  uint uVar5;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar1 = Acb_ObjIsCio(p,iObj);
  if (iVar1 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                  ,0x2de,"int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)");
  }
  vTemp->nSize = 0;
  piVar6 = Acb_ObjFanins(p,iObj);
  for (lVar9 = 0; lVar9 < *piVar6; lVar9 = lVar9 + 1) {
    iVar1 = piVar6[lVar9 + 1];
    iVar2 = Acb_ObjCopy(p,iVar1);
    if (iVar2 < 0) {
      __assert_fail("Acb_ObjCopy(p, iFanin) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x2e2,"int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)"
                   );
    }
    iVar1 = Acb_ObjCopy(p,iVar1);
    Vec_IntPush(vTemp,iVar1);
  }
  AVar3 = Acb_ObjType(p,iObj);
  if ((char)AVar3 == '\a') {
    iVar1 = 0;
  }
  else {
    if ((AVar3 & 0xff) != ABC_OPER_CONST_T) {
      if (AVar3 - ABC_OPER_BIT_BUF < 2) {
        Lit = Vec_IntEntry(vTemp,0);
        if (fUseBuf != 0) {
          pGVar7 = Gia_ManAppendObj(pNew);
          if (((int)Lit < 0) || (pNew->nObjs <= (int)(Lit >> 1))) {
            __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x30c,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
          }
          iVar1 = Gia_ObjId(pNew,pGVar7);
          uVar11 = (ulong)(iVar1 - (Lit >> 1) & 0x1fffffff);
          *(ulong *)pGVar7 =
               (ulong)((Lit & 1) << 0x1d) |
               (ulong)(Lit & 1) << 0x3d | *(ulong *)pGVar7 & 0xc0000000c0000000 | uVar11 << 0x20 |
               uVar11;
          pNew->nBufs = pNew->nBufs + 1;
          iVar1 = Gia_ObjId(pNew,pGVar7);
          Lit = iVar1 * 2;
        }
        uVar5 = (uint)(AVar3 == ABC_OPER_BIT_INV);
      }
      else if (AVar3 - ABC_OPER_BIT_AND < 2) {
        Lit = 1;
        for (iVar1 = 0; iVar1 < vTemp->nSize; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(vTemp,iVar1);
          Lit = Gia_ManAppendAnd2(pNew,Lit,iVar2);
        }
        uVar5 = (uint)(AVar3 == ABC_OPER_BIT_NAND);
      }
      else if (AVar3 - ABC_OPER_BIT_OR < 2) {
        Lit = 0;
        for (iVar1 = 0; iVar1 < vTemp->nSize; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(vTemp,iVar1);
          iVar4 = Abc_LitNot(Lit);
          iVar2 = Abc_LitNot(iVar2);
          iVar2 = Gia_ManAppendAnd2(pNew,iVar4,iVar2);
          Lit = Abc_LitNot(iVar2);
        }
        uVar5 = (uint)(AVar3 == ABC_OPER_BIT_NOR);
      }
      else {
        if (1 < AVar3 - ABC_OPER_BIT_XOR) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                        ,0x304,
                        "int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)");
        }
        Lit = 0;
        for (iVar1 = 0; iVar1 < vTemp->nSize; iVar1 = iVar1 + 1) {
          uVar5 = Vec_IntEntry(vTemp,iVar1);
          if (fUseXors == 0) {
            iVar2 = Abc_LitNot(uVar5);
            iVar4 = Abc_LitNot(Lit);
            iVar4 = Gia_ManAppendAnd2(pNew,iVar4,uVar5);
            iVar2 = Gia_ManAppendAnd2(pNew,Lit,iVar2);
            iVar4 = Abc_LitNot(iVar4);
            iVar2 = Abc_LitNot(iVar2);
            iVar2 = Gia_ManAppendAnd2(pNew,iVar4,iVar2);
            uVar8 = Abc_LitNotCond(iVar2,1);
          }
          else if (pNew->fGiaSimple == 0) {
            uVar8 = uVar5;
            uVar10 = Lit;
            if (((int)Lit < 2) || (uVar8 = Lit, uVar10 = uVar5, (int)uVar5 < 2)) {
              if (uVar10 != 0) {
                uVar8 = Abc_LitNot(uVar8);
              }
            }
            else {
              uVar8 = 0;
              if (Lit != uVar5) {
                uVar10 = Abc_LitNot(uVar5);
                uVar8 = 1;
                if (uVar10 != Lit) goto LAB_0033b0a9;
              }
            }
          }
          else {
LAB_0033b0a9:
            pGVar7 = Gia_ManAppendObj(pNew);
            if ((int)Lit < 0) {
LAB_0033b2e7:
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            uVar8 = Lit >> 1;
            if (pNew->nObjs <= (int)uVar8) goto LAB_0033b2e7;
            if (((int)uVar5 < 0) || (uVar10 = uVar5 >> 1, (uint)pNew->nObjs <= uVar10)) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            if (uVar8 == uVar10) {
              __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x2d7,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            iVar2 = Gia_ObjId(pNew,pGVar7);
            uVar11 = (ulong)(iVar2 - uVar8 & 0x1fffffff);
            if (uVar10 < uVar8) {
              *(ulong *)pGVar7 =
                   (ulong)((Lit & 1) << 0x1d) | *(ulong *)pGVar7 & 0xffffffffc0000000 | uVar11;
              iVar2 = Gia_ObjId(pNew,pGVar7);
              uVar11 = (ulong)(uVar5 & 1) << 0x3d | (ulong)(iVar2 - uVar10 & 0x1fffffff) << 0x20 |
                       *(ulong *)pGVar7 & 0xc0000000ffffffff;
            }
            else {
              *(ulong *)pGVar7 =
                   (ulong)(Lit & 1) << 0x3d | uVar11 << 0x20 | *(ulong *)pGVar7 & 0xc0000000ffffffff
              ;
              iVar2 = Gia_ObjId(pNew,pGVar7);
              uVar11 = (ulong)((uVar5 & 1) << 0x1d) | *(ulong *)pGVar7 & 0xffffffffc0000000 |
                       (ulong)(iVar2 - uVar10 & 0x1fffffff);
            }
            *(ulong *)pGVar7 = uVar11;
            pNew->nXors = pNew->nXors + 1;
            iVar2 = Gia_ObjId(pNew,pGVar7);
            uVar8 = iVar2 * 2;
          }
          Lit = uVar8;
        }
        uVar5 = (uint)(AVar3 == ABC_OPER_BIT_NXOR);
      }
      iVar1 = Abc_LitNotCond(Lit,uVar5);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Acb_ObjToGia2( Gia_Man_t * pNew, int fUseBuf, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp, int fUseXors )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type, Res;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        assert( Acb_ObjCopy(p, iFanin) >= 0 );
        Vec_IntPush( vTemp, Acb_ObjCopy(p, iFanin) );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
        return 0;
    if ( Type == ABC_OPER_CONST_T ) 
        return 1;
    if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_BIT_INV ) 
    {
        Res = fUseBuf ? Gia_ManAppendBuf(pNew, Vec_IntEntry(vTemp, 0)) : Vec_IntEntry(vTemp, 0);
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_INV );
    }
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Res = 1;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManAppendAnd2( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NAND );
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManAppendOr2( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NOR );
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = fUseXors ? Gia_ManAppendXorReal2(pNew, Res, iFanin) : Gia_ManAppendXor2(pNew, Res, iFanin);
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NXOR );
    }
    assert( 0 );
    return -1;
}